

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-impl-text.cpp
# Opt level: O3

void ImTui_ImplText_RenderDrawData(ImDrawData *drawData,TScreen *screen)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ImVec2 IVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  ImDrawList *pIVar9;
  ImDrawCmd *pIVar10;
  unsigned_short *puVar11;
  ImDrawVert *pIVar12;
  float fVar13;
  float fVar14;
  byte bVar15;
  undefined4 in_EAX;
  int iVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  ImGuiIO *pIVar20;
  TCell *pTVar21;
  uchar col;
  long lVar22;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  long lVar26;
  uint uVar27;
  uint uVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  int iVar34;
  undefined1 auVar33 [16];
  float fVar35;
  undefined1 auVar36 [16];
  int iVar37;
  int iVar39;
  undefined1 auVar38 [16];
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined4 uVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float local_118;
  float local_98;
  float fStack_94;
  
  iVar37 = (int)((drawData->FramebufferScale).x * (drawData->DisplaySize).x);
  iVar39 = (int)((drawData->FramebufferScale).y * (drawData->DisplaySize).y);
  auVar33._0_4_ = -(uint)(0 < iVar37);
  auVar33._4_4_ = -(uint)(0 < iVar37);
  auVar33._8_4_ = -(uint)(0 < iVar39);
  auVar33._12_4_ = -(uint)(0 < iVar39);
  iVar16 = movmskpd(in_EAX,auVar33);
  if (iVar16 != 3) {
    return;
  }
  pIVar20 = ImGui::GetIO();
  IVar3 = pIVar20->DisplaySize;
  pIVar20 = ImGui::GetIO();
  local_118 = IVar3.x;
  iVar16 = (int)local_118;
  iVar34 = (int)(pIVar20->DisplaySize).y;
  screen->nx = iVar16;
  screen->ny = iVar34;
  iVar17 = iVar34 * iVar16;
  pTVar21 = screen->data;
  if (screen->nmax < iVar17) {
    if (pTVar21 != (TCell *)0x0) {
      operator_delete__(pTVar21);
      iVar16 = screen->nx;
      iVar34 = screen->ny;
      iVar17 = iVar34 * iVar16;
    }
    screen->nmax = iVar17;
    uVar25 = 0xffffffffffffffff;
    if (-1 < iVar17) {
      uVar25 = (long)iVar17 * 4;
    }
    pTVar21 = (TCell *)operator_new__(uVar25);
    screen->data = pTVar21;
  }
  else if (pTVar21 == (TCell *)0x0) goto LAB_00119e9b;
  memset(pTVar21,0,(long)(iVar16 * iVar34) << 2);
LAB_00119e9b:
  iVar16 = drawData->CmdListsCount;
  if (0 < iVar16) {
    fVar13 = (drawData->DisplayPos).x;
    fVar14 = (drawData->DisplayPos).y;
    IVar3 = drawData->FramebufferScale;
    lVar23 = 0;
    do {
      pIVar9 = drawData->CmdLists[lVar23];
      iVar34 = (pIVar9->CmdBuffer).Size;
      if (0 < iVar34) {
        lVar22 = 0;
        local_98 = IVar3.x;
        fStack_94 = IVar3.y;
        do {
          pIVar10 = (pIVar9->CmdBuffer).Data;
          uVar1 = pIVar10[lVar22].ClipRect.x;
          uVar4 = pIVar10[lVar22].ClipRect.y;
          fVar40 = ((float)uVar1 - fVar13) * local_98;
          fVar41 = ((float)uVar4 - fVar14) * fStack_94;
          if ((fVar40 < (float)iVar37) && (fVar41 < (float)iVar39)) {
            uVar2 = pIVar10[lVar22].ClipRect.z;
            uVar5 = pIVar10[lVar22].ClipRect.w;
            fVar42 = ((float)uVar2 - fVar13) * local_98;
            fVar43 = ((float)uVar5 - fVar14) * fStack_94;
            if ((0.0 <= fVar42) && ((0.0 <= fVar43 && (pIVar10[lVar22].ElemCount != 0)))) {
              uVar28 = 0;
              fVar29 = -10000.0;
              uVar48 = 0;
              uVar49 = 0;
              uVar50 = 0;
              fVar35 = fVar29;
              do {
                uVar19 = pIVar10[lVar22].IdxOffset;
                iVar16 = uVar19 + uVar28;
                puVar11 = (pIVar9->IdxBuffer).Data;
                pIVar12 = (pIVar9->VtxBuffer).Data;
                uVar6 = puVar11[iVar16];
                uVar7 = puVar11[(int)(uVar19 + 1 + uVar28)];
                uVar8 = puVar11[(int)(uVar19 + 2 + uVar28)];
                auVar45._8_8_ = 0;
                auVar45._0_4_ = pIVar12[uVar6].pos.x;
                auVar45._4_4_ = pIVar12[uVar6].pos.y;
                auVar51._8_8_ = 0;
                auVar51._0_4_ = pIVar12[uVar7].pos.x;
                auVar51._4_4_ = pIVar12[uVar7].pos.y;
                auVar52._8_8_ = 0;
                auVar52._0_4_ = pIVar12[uVar8].pos.x;
                auVar52._4_4_ = pIVar12[uVar8].pos.y;
                auVar53._4_4_ = fVar43 + -1.0;
                auVar53._0_4_ = fVar42 + -1.0;
                auVar53._8_8_ = 0;
                auVar33 = minps(auVar45,auVar53);
                auVar44._4_4_ = fVar41;
                auVar44._0_4_ = fVar40;
                auVar44._8_8_ = 0;
                auVar45 = maxps(auVar44,auVar33);
                auVar33 = minps(auVar51,auVar53);
                auVar36._4_4_ = fVar41;
                auVar36._0_4_ = fVar40;
                auVar36._8_8_ = 0;
                auVar33 = maxps(auVar36,auVar33);
                auVar53 = minps(auVar52,auVar53);
                auVar38._4_4_ = fVar41;
                auVar38._0_4_ = fVar40;
                auVar38._8_8_ = 0;
                auVar53 = maxps(auVar38,auVar53);
                fVar31 = pIVar12[uVar6].uv.x;
                fVar32 = pIVar12[uVar7].uv.x;
                uVar19 = pIVar12[uVar6].col;
                if ((((fVar31 != fVar32) || (fVar30 = pIVar12[uVar8].uv.x, fVar31 != fVar30)) ||
                    (fVar32 != fVar30)) || (NAN(fVar32) || NAN(fVar30))) {
LAB_0011a1af:
                  auVar46._4_4_ = auVar45._4_4_ + auVar33._4_4_ + auVar53._4_4_;
                  auVar46._0_4_ = auVar46._4_4_;
                  auVar46._8_4_ = auVar46._4_4_;
                  auVar46._12_4_ = auVar46._4_4_;
                  auVar47._4_12_ = auVar46._4_12_;
                  fVar31 = (pIVar12[puVar11[iVar16 + 3]].pos.x +
                            auVar45._0_4_ + auVar33._0_4_ + auVar53._0_4_ +
                            pIVar12[puVar11[iVar16 + 4]].pos.x + pIVar12[puVar11[iVar16 + 5]].pos.x)
                           / 6.0;
                  auVar47._0_4_ =
                       (auVar46._4_4_ + pIVar12[puVar11[iVar16 + 3]].pos.y +
                        pIVar12[puVar11[iVar16 + 4]].pos.y + pIVar12[puVar11[iVar16 + 5]].pos.y) /
                       6.0 + 0.5;
                  if ((ABS(auVar47._0_4_ - fVar29) < 0.5) && (ABS(fVar31 - fVar35) < 0.5)) {
                    fVar31 = fVar35 + 1.0;
                    auVar47._4_4_ = uVar48;
                    auVar47._0_4_ = fVar29;
                    auVar47._8_4_ = uVar49;
                    auVar47._12_4_ = uVar50;
                  }
                  fVar35 = (float)(int)(fVar31 + 1.0);
                  fVar29 = auVar47._0_4_;
                  if ((fVar40 <= fVar35) && (fVar35 < fVar42)) {
                    fVar35 = (float)(int)(fVar29 + 0.0);
                    if ((fVar41 <= fVar35) && (fVar35 < fVar43)) {
                      pTVar21 = screen->data;
                      lVar26 = (long)((int)(fVar29 + 0.0) * screen->nx + (int)(fVar31 + 1.0));
                      bVar15 = *(byte *)((long)pTVar21 + lVar26 * 4 + 3);
                      uVar18 = uVar19 >> 8 & 0xff;
                      uVar24 = uVar19 >> 0x10 & 0xff;
                      if (uVar18 == uVar24 && (uVar19 & 0xff) == uVar18) {
                        uVar18 = 0x10;
                        if ((7 < (byte)uVar19) && (uVar18 = 0xe7, (byte)uVar19 < 0xf9)) {
                          fVar30 = roundf(((float)(int)((uVar19 & 0xff) - 8) / 247.0) * 24.0);
                          fVar30 = fVar30 + 232.0;
                          goto LAB_0011a5b1;
                        }
                      }
                      else {
                        fVar35 = roundf(((float)(uVar19 & 0xff) / 255.0) * 5.0);
                        fVar32 = roundf(((float)uVar18 / 255.0) * 5.0);
                        fVar30 = roundf(((float)uVar24 / 255.0) * 5.0);
                        fVar30 = fVar30 + fVar32 * 6.0 + fVar35 * 36.0 + 16.0;
LAB_0011a5b1:
                        uVar18 = (uint)fVar30;
                      }
                      pTVar21[lVar26] =
                           (uVar18 & 0xff) << 0x10 | uVar19 >> 0x18 | (uint)bVar15 << 0x18;
                    }
                  }
                  uVar28 = uVar28 + 3;
                  uVar48 = auVar47._4_4_;
                  uVar49 = auVar47._8_4_;
                  uVar50 = auVar47._12_4_;
                }
                else {
                  fVar31 = pIVar12[uVar6].uv.y;
                  fVar32 = pIVar12[uVar7].uv.y;
                  if (((fVar31 != fVar32) || (fVar30 = pIVar12[uVar8].uv.y, fVar31 != fVar30)) ||
                     ((fVar32 != fVar30 || (NAN(fVar32) || NAN(fVar30))))) goto LAB_0011a1af;
                  uVar18 = uVar19 & 0xff;
                  uVar27 = uVar19 >> 8 & 0xff;
                  uVar24 = uVar19 >> 0x10 & 0xff;
                  if (uVar27 == uVar24 && uVar18 == uVar27) {
                    uVar19 = (uint)(((float)(uVar19 >> 0x18) * (float)uVar18) / 255.0);
                    col = '\x10';
                    bVar15 = (byte)uVar19;
                    if (7 < bVar15) {
                      col = 0xe7;
                      if (bVar15 < 0xf9) {
                        fVar30 = roundf(((float)(int)((uVar19 & 0xff) - 8) / 247.0) * 24.0);
                        fVar30 = fVar30 + 232.0;
                        goto LAB_0011a484;
                      }
                    }
                  }
                  else {
                    fVar30 = (float)(uVar19 >> 0x18) / 255.0;
                    fVar31 = roundf((float)uVar18 * fVar30);
                    fVar32 = roundf((float)uVar27 * fVar30);
                    fVar30 = roundf((float)uVar24 * fVar30);
                    fVar31 = roundf(((float)((int)fVar31 & 0xff) / 255.0) * 5.0);
                    fVar32 = roundf(((float)((int)fVar32 & 0xff) / 255.0) * 5.0);
                    fVar30 = roundf(((float)((int)fVar30 & 0xff) / 255.0) * 5.0);
                    fVar30 = fVar30 + fVar32 * 6.0 + fVar31 * 36.0 + 16.0;
LAB_0011a484:
                    col = (uchar)(int)fVar30;
                  }
                  drawTriangle(auVar45._0_8_,auVar33._0_8_,auVar53._0_8_,col,screen);
                  uVar48 = 0;
                  uVar49 = 0;
                  uVar50 = 0;
                  fVar31 = fVar35;
                }
                uVar28 = uVar28 + 3;
                fVar35 = fVar31;
              } while (uVar28 < pIVar10[lVar22].ElemCount);
              iVar34 = (pIVar9->CmdBuffer).Size;
            }
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 < iVar34);
        iVar16 = drawData->CmdListsCount;
      }
      lVar23 = lVar23 + 1;
    } while (lVar23 < iVar16);
  }
  return;
}

Assistant:

void ImTui_ImplText_RenderDrawData(ImDrawData * drawData, ImTui::TScreen * screen) {
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    int fb_width = (int)(drawData->DisplaySize.x * drawData->FramebufferScale.x);
    int fb_height = (int)(drawData->DisplaySize.y * drawData->FramebufferScale.y);

    if (fb_width <= 0 || fb_height <= 0) {
        return;
    }

    screen->resize(ImGui::GetIO().DisplaySize.x, ImGui::GetIO().DisplaySize.y);
    screen->clear();

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = drawData->DisplayPos;         // (0,0) unless using multi-viewports
    ImVec2 clip_scale = drawData->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

    // Render command lists
    for (int n = 0; n < drawData->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = drawData->CmdLists[n];

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            {
                ImVec4 clip_rect;
                clip_rect.x = (pcmd->ClipRect.x - clip_off.x) * clip_scale.x;
                clip_rect.y = (pcmd->ClipRect.y - clip_off.y) * clip_scale.y;
                clip_rect.z = (pcmd->ClipRect.z - clip_off.x) * clip_scale.x;
                clip_rect.w = (pcmd->ClipRect.w - clip_off.y) * clip_scale.y;

                if (clip_rect.x < fb_width && clip_rect.y < fb_height && clip_rect.z >= 0.0f && clip_rect.w >= 0.0f)
                {
                    float lastCharX = -10000.0f;
                    float lastCharY = -10000.0f;

                    for (unsigned int i = 0; i < pcmd->ElemCount; i += 3) {
                        int vidx0 = cmd_list->IdxBuffer[pcmd->IdxOffset + i + 0];
                        int vidx1 = cmd_list->IdxBuffer[pcmd->IdxOffset + i + 1];
                        int vidx2 = cmd_list->IdxBuffer[pcmd->IdxOffset + i + 2];

                        auto pos0 = cmd_list->VtxBuffer[vidx0].pos;
                        auto pos1 = cmd_list->VtxBuffer[vidx1].pos;
                        auto pos2 = cmd_list->VtxBuffer[vidx2].pos;

                        pos0.x = std::max(std::min(float(clip_rect.z - 1), pos0.x), clip_rect.x);
                        pos1.x = std::max(std::min(float(clip_rect.z - 1), pos1.x), clip_rect.x);
                        pos2.x = std::max(std::min(float(clip_rect.z - 1), pos2.x), clip_rect.x);
                        pos0.y = std::max(std::min(float(clip_rect.w - 1), pos0.y), clip_rect.y);
                        pos1.y = std::max(std::min(float(clip_rect.w - 1), pos1.y), clip_rect.y);
                        pos2.y = std::max(std::min(float(clip_rect.w - 1), pos2.y), clip_rect.y);

                        auto uv0 = cmd_list->VtxBuffer[vidx0].uv;
                        auto uv1 = cmd_list->VtxBuffer[vidx1].uv;
                        auto uv2 = cmd_list->VtxBuffer[vidx2].uv;

                        auto col0 = cmd_list->VtxBuffer[vidx0].col;
                        //auto col1 = cmd_list->VtxBuffer[vidx1].col;
                        //auto col2 = cmd_list->VtxBuffer[vidx2].col;

                        if (uv0.x != uv1.x || uv0.x != uv2.x || uv1.x != uv2.x ||
                            uv0.y != uv1.y || uv0.y != uv2.y || uv1.y != uv2.y) {
                            int vvidx0 = cmd_list->IdxBuffer[pcmd->IdxOffset + i + 3];
                            int vvidx1 = cmd_list->IdxBuffer[pcmd->IdxOffset + i + 4];
                            int vvidx2 = cmd_list->IdxBuffer[pcmd->IdxOffset + i + 5];

                            auto ppos0 = cmd_list->VtxBuffer[vvidx0].pos;
                            auto ppos1 = cmd_list->VtxBuffer[vvidx1].pos;
                            auto ppos2 = cmd_list->VtxBuffer[vvidx2].pos;

                            float x = ((pos0.x + pos1.x + pos2.x + ppos0.x + ppos1.x + ppos2.x)/6.0f);
                            float y = ((pos0.y + pos1.y + pos2.y + ppos0.y + ppos1.y + ppos2.y)/6.0f) + 0.5f;

                            if (std::fabs(y - lastCharY) < 0.5f && std::fabs(x - lastCharX) < 0.5f) {
                                x = lastCharX + 1.0f;
                                y = lastCharY;
                            }

                            lastCharX = x;
                            lastCharY = y;

                            int xx = (x) + 1;
                            int yy = (y) + 0;
                            if (xx < clip_rect.x || xx >= clip_rect.z || yy < clip_rect.y || yy >= clip_rect.w) {
                            } else {
                                auto & cell = screen->data[yy*screen->nx + xx];
                                cell &= 0xFF000000;
                                cell |= (col0 & 0xff000000) >> 24;
                                cell |= ((ImTui::TCell)(rgbToAnsi256(col0, false)) << 16);
                            }
                            i += 3;
                        } else {
                            drawTriangle(pos0, pos1, pos2, rgbToAnsi256(col0, true), screen);
                        }
                    }
                }
            }
        }
    }

}